

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

char * TEST_parse_missing_value(void)

{
  int iVar1;
  char *pcVar2;
  cargo_t cargo;
  int j;
  int i;
  char *args [4];
  
  iVar1 = cargo_init(&cargo,0,"program");
  if (iVar1 == 0) {
    args[2] = "1";
    args[3] = "--beta";
    args[0]._0_4_ = 0x127be1;
    args[0]._4_4_ = 0;
    args[1]._0_4_ = 0x124e63;
    args[1]._4_4_ = 0;
    cargo_add_option(cargo,0,"--alpha -a","The alpha","i",&i);
    iVar1 = cargo_add_option(cargo,0,"--beta -b","The beta","i",&j);
    if (iVar1 == 0) {
      pcVar2 = (char *)0x0;
      iVar1 = cargo_parse(cargo,0,1,4,args);
      if (iVar1 == 0) {
        pcVar2 = "Succesfully parsed missing value";
      }
    }
    else {
      pcVar2 = "Failed to add options";
    }
    cargo_destroy(&cargo);
  }
  else {
    pcVar2 = "Failed to init cargo";
  }
  return pcVar2;
}

Assistant:

_TEST_START(TEST_parse_missing_value)
{
    int i;
    int j;
    char *args[] = { "program", "--alpha", "1", "--beta" };

    ret = cargo_add_option(cargo, 0, "--alpha -a", "The alpha", "i", &i);
    ret = cargo_add_option(cargo, 0, "--beta -b", "The beta", "i", &j);
    cargo_assert(ret == 0, "Failed to add options");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    cargo_assert(ret != 0, "Succesfully parsed missing value");

    _TEST_CLEANUP();
}